

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O1

Reader * __thiscall
capnp::Orphan<capnp::DynamicList>::getReader
          (Reader *__return_storage_ptr__,Orphan<capnp::DynamicList> *this)

{
  anon_union_8_2_eba6ea51_for_Type_5 aVar1;
  Which WVar2;
  uint8_t uVar3;
  bool bVar4;
  anon_union_2_2_d12d5221_for_Type_3 aVar5;
  undefined2 uVar6;
  ElementSize elementSize;
  Which elementType;
  
  WVar2 = (this->schema).elementType.baseType;
  uVar3 = (this->schema).elementType.listDepth;
  bVar4 = (this->schema).elementType.isImplicitParam;
  aVar5 = (this->schema).elementType.field_3;
  uVar6 = *(undefined2 *)&(this->schema).elementType.field_0x6;
  aVar1 = (this->schema).elementType.field_4;
  elementType = LIST;
  if ((this->schema).elementType.listDepth == '\0') {
    elementType = (this->schema).elementType.baseType;
  }
  elementSize = anon_unknown_71::elementSizeFor(elementType);
  capnp::_::OrphanBuilder::asListReader(&__return_storage_ptr__->reader,&this->builder,elementSize);
  (__return_storage_ptr__->schema).elementType.baseType = WVar2;
  (__return_storage_ptr__->schema).elementType.listDepth = uVar3;
  (__return_storage_ptr__->schema).elementType.isImplicitParam = bVar4;
  (__return_storage_ptr__->schema).elementType.field_3 = aVar5;
  *(undefined2 *)&(__return_storage_ptr__->schema).elementType.field_0x6 = uVar6;
  (__return_storage_ptr__->schema).elementType.field_4 = aVar1;
  return __return_storage_ptr__;
}

Assistant:

DynamicList::Reader Orphan<DynamicList>::getReader() const {
  return DynamicList::Reader(
      schema, builder.asListReader(elementSizeFor(schema.whichElementType())));
}